

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O1

void __thiscall OpenMD::Bond::calcForce(Bond *this,bool doParticlePot)

{
  RealType *pRVar1;
  double *pdVar2;
  double dVar3;
  pointer ppAVar4;
  Atom *pAVar5;
  DataStoragePointer DVar6;
  Snapshot *pSVar7;
  DataStoragePointer DVar8;
  Snapshot *pSVar9;
  uint i;
  long lVar10;
  long lVar11;
  long lVar12;
  uint i_4;
  uint i_5;
  long lVar13;
  double tmp;
  Vector<double,_3U> result;
  Vector<double,_3U> tmp_1;
  Vector3d force;
  Vector3d r12;
  RealType dvdr;
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  Vector3d local_78;
  double local_58 [4];
  double local_38 [3];
  
  lVar10 = 0;
  local_78.super_Vector<double,_3U>.data_[2] = 0.0;
  local_78.super_Vector<double,_3U>.data_[0] = 0.0;
  local_78.super_Vector<double,_3U>.data_[1] = 0.0;
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  ppAVar4 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar5 = ppAVar4[1];
  lVar12 = (long)(pAVar5->super_StuntDouble).localIndex_;
  lVar11 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar5->super_StuntDouble).storage_);
  local_58[2] = (double)*(undefined8 *)(lVar11 + 0x10 + lVar12 * 0x18);
  pdVar2 = (double *)(lVar11 + lVar12 * 0x18);
  local_58[0] = *pdVar2;
  local_58[1] = pdVar2[1];
  pAVar5 = *ppAVar4;
  lVar12 = (long)(pAVar5->super_StuntDouble).localIndex_;
  lVar11 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar5->super_StuntDouble).storage_);
  local_38[2] = (double)*(undefined8 *)(lVar11 + 0x10 + lVar12 * 0x18);
  pdVar2 = (double *)(lVar11 + lVar12 * 0x18);
  local_38[0] = *pdVar2;
  local_38[1] = pdVar2[1];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  do {
    local_d8[lVar10] = local_58[lVar10] - local_38[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  local_78.super_Vector<double,_3U>.data_[2] = local_d8[2];
  local_78.super_Vector<double,_3U>.data_[0] = local_d8[0];
  local_78.super_Vector<double,_3U>.data_[1] = local_d8[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_78);
  local_d8[3] = 0.0;
  lVar11 = 0;
  do {
    dVar3 = local_78.super_Vector<double,_3U>.data_[lVar11];
    local_d8[3] = local_d8[3] + dVar3 * dVar3;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (local_d8[3] < 0.0) {
    local_d8[3] = sqrt(local_d8[3]);
  }
  else {
    local_d8[3] = SQRT(local_d8[3]);
  }
  pRVar1 = &this->potential_;
  (*this->bondType_->_vptr_BondType[2])(this->bondType_,pRVar1,local_58);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar11 = 0;
  do {
    local_d8[lVar11] =
         local_78.super_Vector<double,_3U>.data_[lVar11] * (-local_58[0] / local_d8[3]);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  local_98[2] = local_d8[2];
  local_98[0] = local_d8[0];
  local_98[1] = local_d8[1];
  ppAVar4 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar5 = *ppAVar4;
  local_b8[2] = local_d8[2];
  local_b8[0] = local_d8[0];
  local_b8[1] = local_d8[1];
  lVar11 = 0;
  do {
    local_b8[lVar11] = -local_b8[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  DVar6 = (pAVar5->super_StuntDouble).storage_;
  pSVar7 = ((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar11 = (long)(pAVar5->super_StuntDouble).localIndex_;
  lVar10 = lVar11 * 0x18 +
           *(long *)((long)&(pSVar7->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar6);
  lVar12 = 0;
  do {
    *(double *)(lVar10 + lVar12 * 8) = local_b8[lVar12] + *(double *)(lVar10 + lVar12 * 8);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  pAVar5 = ppAVar4[1];
  DVar8 = (pAVar5->super_StuntDouble).storage_;
  pSVar9 = ((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar10 = (long)(pAVar5->super_StuntDouble).localIndex_;
  lVar12 = lVar10 * 0x18 +
           *(long *)((long)&(pSVar9->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar8);
  lVar13 = 0;
  do {
    *(double *)(lVar12 + lVar13 * 8) = local_98[lVar13] + *(double *)(lVar12 + lVar13 * 8);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  if (doParticlePot) {
    lVar12 = *(long *)((long)&(pSVar7->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar6);
    *(double *)(lVar12 + lVar11 * 8) = *pRVar1 + *(double *)(lVar12 + lVar11 * 8);
    lVar11 = *(long *)((long)&(pSVar9->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar8);
    *(double *)(lVar11 + lVar10 * 8) = *pRVar1 + *(double *)(lVar11 + lVar10 * 8);
  }
  return;
}

Assistant:

void calcForce(bool doParticlePot) {
      RealType len;
      RealType dvdr;
      Vector3d r12;
      Vector3d force;

      r12 = atoms_[1]->getPos() - atoms_[0]->getPos();
      snapshotMan_->getCurrentSnapshot()->wrapVector(r12);
      len = r12.length();
      bondType_->calcForce(len, potential_, dvdr);

      force = r12 * (-dvdr / len);

      atoms_[0]->addFrc(-force);
      atoms_[1]->addFrc(force);
      if (doParticlePot) {
        atoms_[0]->addParticlePot(potential_);
        atoms_[1]->addParticlePot(potential_);
      }
    }